

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O3

QJsonValue *
qt_convertToJson(QJsonValue *__return_storage_ptr__,QCborContainerPrivate *d,qsizetype idx,
                ConversionMode mode)

{
  int iVar1;
  Type TVar2;
  Element *pEVar3;
  Element *pEVar4;
  QCborContainerPrivate *pQVar5;
  long lVar6;
  char *pcVar7;
  undefined8 *puVar8;
  QJsonValue *result;
  bool b;
  Type type;
  long in_FS_OFFSET;
  QByteArrayView input;
  QCborValue local_50;
  QArrayData *local_38;
  QCborContainerPrivate *pQStack_30;
  Data *local_28;
  char *local_20;
  
  local_20 = *(char **)(in_FS_OFFSET + 0x28);
  do {
    if (idx == -0xa0) {
      convertToJsonObject((QCborContainerPrivate *)&stack0xffffffffffffffc8,(ConversionMode)d);
      QJsonValue::QJsonValue(__return_storage_ptr__,(QJsonObject *)&stack0xffffffffffffffc8);
      QJsonObject::~QJsonObject((QJsonObject *)&stack0xffffffffffffffc8);
LAB_002eba4a:
      if (*(char **)(in_FS_OFFSET + 0x28) == local_20) {
        return __return_storage_ptr__;
      }
LAB_002eba5e:
      __stack_chk_fail();
    }
    if (idx == -0x80) {
      convertToJsonArray((QCborContainerPrivate *)&stack0xffffffffffffffc8,(ConversionMode)d);
      QJsonValue::QJsonValue(__return_storage_ptr__,(QJsonArray *)&stack0xffffffffffffffc8);
      QJsonArray::~QJsonArray((QJsonArray *)&stack0xffffffffffffffc8);
      goto LAB_002eba4a;
    }
    if (idx < 0) {
      if ((d == (QCborContainerPrivate *)0x0) || ((d->elements).d.size != 2)) {
        if (*(char **)(in_FS_OFFSET + 0x28) == local_20) {
          type = Undefined;
          goto LAB_002ebc19;
        }
        goto LAB_002eba5e;
      }
      pEVar4 = (d->elements).d.ptr;
      pQVar5 = (pEVar4->field_0).container;
      if (pQVar5 < (QCborContainerPrivate *)0x26) {
        if ((0x2000e00001U >> ((ulong)pQVar5 & 0x3f) & 1) == 0) {
          if (pQVar5 != (QCborContainerPrivate *)0x20) goto LAB_002ebdb4;
          if (pEVar4[1].type == String) {
            lVar6._0_4_ = pEVar4[1].type;
            lVar6._4_4_ = pEVar4[1].flags;
            pcVar7 = (d->data).d.ptr;
            if (pcVar7 == (char *)0x0) {
              pcVar7 = &QByteArray::_empty;
            }
            puVar8 = (undefined8 *)
                     ((lVar6 << 0x1e) >> 0x3f & (ulong)(pcVar7 + pEVar4[1].field_0.value));
            input.m_data = (storage_type *)*puVar8;
            input.m_size = (qsizetype)&local_50;
            QUrl::fromEncoded(input,(int)puVar8 + 8);
            QUrl::toString((QString *)&stack0xffffffffffffffc8,(QUrl *)&local_50,
                           (FormattingOptions)0x1f00000);
            QJsonValue::QJsonValue(__return_storage_ptr__,(QString *)&stack0xffffffffffffffc8);
            if (local_38 != (QArrayData *)0x0) {
              LOCK();
              (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_38,2,0x10);
              }
            }
            QUrl::~QUrl((QUrl *)&local_50);
            goto LAB_002eba4a;
          }
        }
        local_28 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_38 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
        pQStack_30 = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
        maybeEncodeTag((QString *)&stack0xffffffffffffffc8,d);
        if (pQStack_30 != (QCborContainerPrivate *)0x0) {
          QJsonValue::QJsonValue(__return_storage_ptr__,(QString *)&stack0xffffffffffffffc8);
          goto LAB_002ebdd5;
        }
        if (local_38 != (QArrayData *)0x0) {
          LOCK();
          (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_38,2,0x10);
          }
        }
      }
LAB_002ebdb4:
      qt_convertToJson(__return_storage_ptr__,d,1,FromRaw);
      goto LAB_002eba4a;
    }
    pEVar3 = (d->elements).d.ptr;
    pEVar4 = pEVar3 + idx;
    TVar2 = pEVar3[idx].type;
    if ((long)TVar2 < 0x116) {
      if (TVar2 < Map) {
        if (0x7f < TVar2) {
          if (TVar2 != Array) goto LAB_002ebc23;
          goto LAB_002eb9e5;
        }
        if (TVar2 == Invalid) goto LAB_002ebc00;
        if (TVar2 == Integer) {
          if (*(char **)(in_FS_OFFSET + 0x28) == local_20) {
            QJsonValue::QJsonValue(__return_storage_ptr__,(pEVar4->field_0).value);
            return __return_storage_ptr__;
          }
          goto LAB_002eba5e;
        }
        if ((TVar2 != ByteArray) || (mode != FromVariantToJson)) goto LAB_002ebc23;
        local_28 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_38 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
        pQStack_30 = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
        makeString((QString *)&stack0xffffffffffffffc8,d,idx,FromVariantToJson);
        if (local_28 == (Data *)0x0) {
          QJsonValue::QJsonValue(__return_storage_ptr__,Null);
        }
        else {
          QCborValue::QCborValue((QCborValue *)&local_50,(QString *)&stack0xffffffffffffffc8);
          QJsonPrivate::Value::fromTrustedCbor(__return_storage_ptr__,&local_50);
          QCborValue::~QCborValue((QCborValue *)&local_50);
        }
LAB_002ebdd5:
        if (local_38 != (QArrayData *)0x0) {
          LOCK();
          (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          iVar1 = (local_38->ref_)._q_value.super___atomic_base<int>._M_i;
          UNLOCK();
          local_50.n = (qint64)local_38;
joined_r0x002ebde6:
          if (iVar1 == 0) {
            QArrayData::deallocate((QArrayData *)local_50.n,2,0x10);
          }
        }
        goto LAB_002eba4a;
      }
      if (0xbf < TVar2) {
        if (TVar2 == Tag) goto LAB_002eb9e5;
        if (TVar2 == False) {
          if (*(char **)(in_FS_OFFSET + 0x28) == local_20) {
            b = false;
LAB_002ebcd5:
            QJsonValue::QJsonValue(__return_storage_ptr__,b);
            return __return_storage_ptr__;
          }
        }
        else {
          if (TVar2 != True) goto LAB_002ebc23;
          if (*(char **)(in_FS_OFFSET + 0x28) == local_20) {
            b = true;
            goto LAB_002ebcd5;
          }
        }
        goto LAB_002eba5e;
      }
      if (TVar2 != Map) goto LAB_002ebc23;
    }
    else if (TVar2 < Url) {
      if (TVar2 != DateTime) {
        if ((uint)(TVar2 + ~True) < 2) goto LAB_002ebc00;
        if (TVar2 != Double) goto LAB_002ebc23;
        if (*(char **)(in_FS_OFFSET + 0x28) == local_20) {
          fpToJson((double)pEVar4->field_0);
          return __return_storage_ptr__;
        }
        goto LAB_002eba5e;
      }
    }
    else if ((TVar2 != Url) && (TVar2 != Uuid)) {
      if ((TVar2 == RegularExpression) && (mode == FromVariantToJson)) {
LAB_002ebc00:
        if (*(char **)(in_FS_OFFSET + 0x28) == local_20) {
          type = Null;
LAB_002ebc19:
          QJsonValue::QJsonValue(__return_storage_ptr__,type);
          return __return_storage_ptr__;
        }
        goto LAB_002eba5e;
      }
LAB_002ebc23:
      makeString((QString *)&local_50,d,idx,mode);
      QCborValue::QCborValue((QCborValue *)&stack0xffffffffffffffc8,(QString *)&local_50);
      *(undefined1 **)&(__return_storage_ptr__->value).t = &DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->value).n = (qint64)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->value).container = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QJsonValue::QJsonValue(__return_storage_ptr__,Null);
      QCborValue::operator=
                ((QCborValue *)__return_storage_ptr__,(QCborValue *)&stack0xffffffffffffffc8);
      QCborValue::~QCborValue((QCborValue *)&stack0xffffffffffffffc8);
      if ((QArrayData *)local_50.n != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_50.n)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_50.n)->_q_value).super___atomic_base<int>._M_i + -1;
        iVar1 = (((QBasicAtomicInt *)local_50.n)->_q_value).super___atomic_base<int>._M_i;
        UNLOCK();
        goto joined_r0x002ebde6;
      }
      goto LAB_002eba4a;
    }
LAB_002eb9e5:
    if (((pEVar4->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
         super_QFlagsStorage<QtCbor::Element::ValueFlag>.i & 1) == 0) {
      d = (QCborContainerPrivate *)0x0;
    }
    else {
      d = (pEVar4->field_0).container;
    }
    idx = -(long)TVar2;
  } while( true );
}

Assistant:

QJsonValue qt_convertToJson(QCborContainerPrivate *d, qsizetype idx, ConversionMode mode)
{
    // encoding the container itself
    if (idx == -QCborValue::Array)
        return convertToJsonArray(d, mode);
    if (idx == -QCborValue::Map)
        return convertToJsonObject(d, mode);
    if (idx < 0) {
        // tag-like type
        if (!d || d->elements.size() != 2)
            return QJsonValue::Undefined;   // invalid state
        return convertExtendedTypeToJson(d);
    }

    // an element in the container
    const auto &e = d->elements.at(idx);
    switch (e.type) {
    case QCborValue::Integer:
        return QJsonValue(e.value);
    case QCborValue::ByteArray:
        if (mode == ConversionMode::FromVariantToJson) {
            const auto value = makeString(d, idx, mode);
            return value.isEmpty() ? QJsonValue() : QJsonPrivate::Value::fromTrustedCbor(value);
        }
        break;
    case QCborValue::RegularExpression:
        if (mode == ConversionMode::FromVariantToJson)
            return QJsonValue();
        break;
    case QCborValue::String:
    case QCborValue::SimpleType:
        // make string
        break;

    case QCborValue::Array:
    case QCborValue::Map:
    case QCborValue::Tag:
    case QCborValue::DateTime:
    case QCborValue::Url:
    case QCborValue::Uuid:
        // recurse
        return qt_convertToJson(e.flags & Element::IsContainer ? e.container : nullptr, -e.type,
                                mode);

    case QCborValue::Null:
    case QCborValue::Undefined:
    case QCborValue::Invalid:
        return QJsonValue();

    case QCborValue::False:
        return false;

    case QCborValue::True:
        return true;

    case QCborValue::Double:
        return fpToJson(e.fpvalue());
    }

    return QJsonPrivate::Value::fromTrustedCbor(makeString(d, idx, mode));
}